

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::set_size(RepeatedField<int> *this,bool is_soo,int size)

{
  int iVar1;
  void *ptr;
  RepeatedField<long> *this_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar2;
  char cVar3;
  undefined7 in_register_00000031;
  undefined1 *puVar4;
  ulong *puVar5;
  LongSooRep *this_01;
  SooRep *this_02;
  Arena *this_03;
  SooRep *unaff_R14;
  Arena *pAStack_88;
  ulong uStack_80;
  SooRep *pSStack_78;
  undefined1 auStack_40 [8];
  undefined8 uStack_38;
  undefined1 auStack_28 [8];
  code *pcStack_20;
  
  iVar1 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (size <= iVar1) {
    internal::SooRep::set_size(&this->soo_rep_,is_soo,size);
    return;
  }
  puVar5 = (ulong *)(ulong)(uint)size;
  cVar3 = (char)iVar1;
  pcStack_20 = internal::SooRep::set_size;
  set_size();
  if (((*puVar5 & 4) == 0) == (bool)cVar3) {
    if (cVar3 == '\0') {
      *(uint *)(puVar5 + 1) = extraout_EDX;
    }
    else {
      uVar2 = extraout_EDX;
      if (3 < (int)extraout_EDX) goto LAB_00144fad;
      *puVar5 = (long)(int)extraout_EDX | *puVar5 & 0xfffffffffffffff8;
    }
    return;
  }
  uStack_38 = 0x144fad;
  internal::SooRep::set_size();
  uVar2 = extraout_EDX_00;
LAB_00144fad:
  iVar1 = (int)auStack_28;
  this_01 = (LongSooRep *)(ulong)uVar2;
  uStack_38 = 0x144fb9;
  internal::SooRep::set_size();
  uVar2 = 1;
  if (iVar1 == 0) {
    uVar2 = this_01->capacity;
  }
  if (0 < (int)uVar2) {
    if ((char)iVar1 != '\0') {
      return;
    }
    internal::LongSooRep::elements(this_01);
    return;
  }
  puVar4 = auStack_40;
  this_02 = (SooRep *)(ulong)uVar2;
  RepeatedField<long>::elements();
  if ((int)puVar4 < 0) {
    pSStack_78 = (SooRep *)0x14503a;
    RepeatedField<long>::Mutable();
  }
  else {
    pSStack_78 = (SooRep *)0x14500a;
    iVar1 = internal::SooRep::size
                      (this_02,(undefined1  [16])
                               ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    unaff_R14 = this_02;
    if ((int)puVar4 < iVar1) {
      pSStack_78 = (SooRep *)0x145020;
      RepeatedField<long>::elements
                ((RepeatedField<long> *)this_02,
                 (undefined1  [16])((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  this_03 = (Arena *)((ulong)puVar4 & 0xffffffff);
  pSStack_78 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>;
  RepeatedField<long>::Mutable();
  uStack_80 = (ulong)puVar4 & 0xffffffff;
  pSStack_78 = unaff_R14;
  if (this_03 == (Arena *)0x0) {
    this_00 = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField<long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_03,0x10);
    pAStack_88 = this_03;
    Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_88);
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }